

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptAsyncGenerator.cpp
# Opt level: O2

Var Js::JavascriptAsyncGenerator::EntryAwaitFulfilledCallback
              (RecyclableObject *function,CallInfo callInfo,...)

{
  Type TVar1;
  ScriptContext *scriptContext;
  JavascriptAsyncGenerator *this;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  Var value;
  AsyncGeneratorCallbackFunction *pAVar5;
  ResumeYieldKind resumeKind;
  int in_stack_00000010;
  undefined1 local_38 [8];
  ArgumentReader args;
  CallInfo callInfo_local;
  
  scriptContext =
       (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
       scriptContext.ptr;
  args.super_Arguments.Values = (Type)callInfo;
  ThreadContext::ProbeStack(scriptContext->threadContext,0xc00,scriptContext,(PVOID)0x0);
  if (callInfo._0_4_ != in_stack_00000010) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptAsyncGenerator.cpp"
                                ,0x79,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) goto LAB_00a76176;
    *puVar4 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)local_38,(CallInfo *)&args.super_Arguments.Values,
             (Var *)&stack0x00000018);
  if ((local_38._0_4_ & 0xfffffe) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptAsyncGenerator.cpp"
                                ,0x7b,"(args.Info.Count > 1)","args.Info.Count > 1");
    if (!bVar3) goto LAB_00a76176;
    *puVar4 = 0;
  }
  value = Arguments::operator[]((Arguments *)local_38,1);
  pAVar5 = VarTo<Js::AsyncGeneratorCallbackFunction,Js::RecyclableObject>(function);
  this = (pAVar5->generator).ptr;
  TVar1 = this->pendingState;
  this->pendingState = None;
  if (TVar1 == Yield) {
    ResolveNext(this,value);
  }
  else {
    if (TVar1 == AwaitReturn) {
      resumeKind = Return;
    }
    else {
      if (TVar1 != Await) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar4 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptAsyncGenerator.cpp"
                                    ,0x90,"(false)","Expected an async generator pending state");
        if (!bVar3) {
LAB_00a76176:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar4 = 0;
        goto LAB_00a76160;
      }
      resumeKind = Normal;
    }
    ResumeCoroutine(this,value,resumeKind);
  }
LAB_00a76160:
  return (((scriptContext->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase)
         .undefinedValue.ptr;
}

Assistant:

Var JavascriptAsyncGenerator::EntryAwaitFulfilledCallback(
    RecyclableObject* function,
    CallInfo callInfo, ...)
{
    auto* scriptContext = function->GetScriptContext();

    PROBE_STACK(scriptContext, Js::Constants::MinStackDefault);
    ARGUMENTS(args, callInfo);

    AssertOrFailFast(args.Info.Count > 1);

    Var value = args[1];
    auto* callbackFn = VarTo<AsyncGeneratorCallbackFunction>(function);
    JavascriptAsyncGenerator* generator = callbackFn->generator;

    PendingState state = generator->pendingState;
    generator->pendingState = PendingState::None;

    switch (state)
    {
        case PendingState::Await:
            generator->ResumeCoroutine(value, ResumeYieldKind::Normal);
            break;
        case PendingState::AwaitReturn:
            generator->ResumeCoroutine(value, ResumeYieldKind::Return);
            break;
        case PendingState::Yield:
            generator->ResolveNext(value);
            break;
        default:
            AssertMsg(false, "Expected an async generator pending state");
            break;
    }

    return scriptContext->GetLibrary()->GetUndefined();
}